

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O2

ImaginaryFloatingConstant * __thiscall
psy::TextElementTable<psy::C::ImaginaryFloatingConstant>::find
          (TextElementTable<psy::C::ImaginaryFloatingConstant> *this,char *chars,uint size)

{
  ImaginaryFloatingConstant *pIVar1;
  int iVar2;
  ulong uVar3;
  ImaginaryFloatingConstant **ppIVar4;
  
  if (this->buckets_ != (ImaginaryFloatingConstant **)0x0) {
    uVar3 = psy::TextElement::hashCode(chars,size);
    ppIVar4 = this->buckets_ + (uVar3 & 0xffffffff) % (ulong)(uint)this->bucketCount_;
    while (pIVar1 = *ppIVar4, pIVar1 != (ImaginaryFloatingConstant *)0x0) {
      if ((*(uint *)&(pIVar1->super_Lexeme).field_0x8 == size) &&
         (iVar2 = strncmp(*(char **)&(pIVar1->super_Lexeme).field_0x10,chars,(ulong)size),
         iVar2 == 0)) {
        return pIVar1;
      }
      ppIVar4 = (ImaginaryFloatingConstant **)&(pIVar1->super_Lexeme).field_0x20;
    }
  }
  return (ImaginaryFloatingConstant *)0x0;
}

Assistant:

const ElemT* find(const char* chars, unsigned int size) const
    {
        if (buckets_) {
            unsigned int h = ElemT::hashCode(chars, size);
            ElemT* elem = buckets_[h % bucketCount_];
            for (; elem; elem = static_cast<ElemT*>(elem->next_)) {
                if (elem->size() == size && !std::strncmp(elem->c_str(), chars, size))
                    return elem;
            }
        }
        return nullptr;
    }